

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox_p.h
# Opt level: O1

QSize __thiscall
QComboMenuDelegate::sizeHint
          (QComboMenuDelegate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  QStyle *pQVar1;
  QSize QVar2;
  long in_FS_OFFSET;
  QStyleOptionMenuItem opt;
  undefined8 local_c8;
  QStyleOptionMenuItem local_c0;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_c0,0xaa,0x98);
  getStyleOption(&local_c0,this,option,index);
  pQVar1 = QWidget::style(&this->mCombo->super_QWidget);
  local_c8 = CONCAT44(((option->super_QStyleOption).rect.y2.m_i -
                      (option->super_QStyleOption).rect.y1.m_i) + 1,
                      ((option->super_QStyleOption).rect.x2.m_i -
                      (option->super_QStyleOption).rect.x1.m_i) + 1);
  QVar2 = (QSize)(**(code **)(*(long *)pQVar1 + 0xe8))(pQVar1,7,&local_c0,&local_c8,this->mCombo);
  QFont::~QFont(&local_c0.font);
  QIcon::~QIcon(&local_c0.icon);
  if (&(local_c0.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c0.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStyleOption::~QStyleOption(&local_c0.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSize sizeHint(const QStyleOptionViewItem &option,
                   const QModelIndex &index) const override {
        QStyleOptionMenuItem opt = getStyleOption(option, index);
        return mCombo->style()->sizeFromContents(
            QStyle::CT_MenuItem, &opt, option.rect.size(), mCombo);
    }